

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

void xmlLoadCatalogs(char *pathss)

{
  char *cur_00;
  xmlChar *filename;
  bool bVar1;
  xmlChar *path;
  char *paths;
  char *cur;
  char *pathss_local;
  
  paths = pathss;
  if (pathss != (char *)0x0) {
    while (*paths != '\0') {
      while( true ) {
        cur_00 = paths;
        bVar1 = true;
        if ((*paths != ' ') && ((*paths < '\t' || (bVar1 = true, '\n' < *paths)))) {
          bVar1 = *paths == '\r';
        }
        if (!bVar1) break;
        paths = paths + 1;
      }
      if (*paths != '\0') {
        while( true ) {
          bVar1 = false;
          if ((*paths != '\0') && (bVar1 = false, *paths != ':')) {
            bVar1 = true;
            if ((*paths != ' ') && ((*paths < '\t' || (bVar1 = true, '\n' < *paths)))) {
              bVar1 = *paths == '\r';
            }
            bVar1 = (bool)(bVar1 ^ 1);
          }
          if (!bVar1) break;
          paths = paths + 1;
        }
        filename = xmlStrndup((xmlChar *)cur_00,(int)paths - (int)cur_00);
        if (filename != (xmlChar *)0x0) {
          xmlLoadCatalog((char *)filename);
          (*xmlFree)(filename);
        }
      }
      for (; *paths == ':'; paths = paths + 1) {
      }
    }
  }
  return;
}

Assistant:

void
xmlLoadCatalogs(const char *pathss) {
    const char *cur;
    const char *paths;
    xmlChar *path;
#ifdef _WIN32
    int i, iLen;
#endif

    if (pathss == NULL)
	return;

    cur = pathss;
    while (*cur != 0) {
	while (xmlIsBlank_ch(*cur)) cur++;
	if (*cur != 0) {
	    paths = cur;
	    while ((*cur != 0) && (*cur != PATH_SEPARATOR) && (!xmlIsBlank_ch(*cur)))
		cur++;
	    path = xmlStrndup((const xmlChar *)paths, cur - paths);
	    if (path != NULL) {
#ifdef _WIN32
        iLen = strlen((const char*)path);
        for(i = 0; i < iLen; i++) {
            if(path[i] == '\\') {
                path[i] = '/';
            }
        }
#endif
		xmlLoadCatalog((const char *) path);
		xmlFree(path);
	    }
	}
	while (*cur == PATH_SEPARATOR)
	    cur++;
    }
}